

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimSeq.c
# Opt level: O1

int Raig_ManSimulate(Aig_Man_t *pAig,int nWords,int nIters,int TimeLimit,int fMiter,int fVerbose)

{
  Raig_Man_t *pRVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  Abc_Cex_t *pAVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  timespec ts;
  int iPat;
  Sec_MtrStatus_t local_78;
  Raig_Man_t *local_58;
  int local_50;
  int local_4c;
  ulong local_48;
  double local_40;
  long local_38;
  
  local_50 = fMiter;
  iVar2 = clock_gettime(3,(timespec *)&local_78);
  if (iVar2 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = (long)local_78._8_8_ / 1000 + local_78._0_8_ * 1000000;
  }
  if (pAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                  ,0x1cc,"int Raig_ManSimulate(Aig_Man_t *, int, int, int, int, int)");
  }
  Sec_MiterStatus(&local_78,pAig);
  if (local_78.nSat < 1) {
    if (local_78.nUndec == 0) {
      puts("Miter is trivially unsatisfiable.");
      uVar4 = 0;
    }
    else {
      Aig_ManRandom(1);
      local_58 = Raig_ManCreate(pAig);
      local_58->nWords = nWords;
      local_48 = (ulong)(uint)nWords;
      if (nIters < 1) {
        iVar2 = 0;
      }
      else {
        local_40 = (double)lVar8;
        local_38 = (long)TimeLimit;
        iVar9 = 0;
        do {
          iVar2 = clock_gettime(3,(timespec *)&local_78);
          if (iVar2 < 0) {
            lVar7 = 1;
          }
          else {
            lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)local_78._8_8_),8);
            lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_78._0_8_ * -1000000;
          }
          iVar2 = Raig_ManSimulateRound(local_58,local_50,(uint)(iVar9 == 0),&local_4c);
          if (fVerbose != 0) {
            printf("Frame %4d out of %4d and timeout %3d sec. ",(ulong)(iVar9 + 1),
                   (ulong)(uint)nIters,(ulong)(uint)TimeLimit);
            iVar3 = clock_gettime(3,(timespec *)&local_78);
            dVar10 = -1.0;
            if (-1 < iVar3) {
              dVar10 = (double)((long)local_78._8_8_ / 1000 + local_78._0_8_ * 1000000);
            }
            printf("Time = %7.2f sec\r",(dVar10 - local_40) / 1000000.0);
          }
          pRVar1 = local_58;
          if (0 < iVar2) {
            uVar4 = Raig_ManFindPo(local_58->pAig,iVar2);
            if (pAig->pSeqModel != (Abc_Cex_t *)0x0) {
              __assert_fail("pAig->pSeqModel == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                            ,0x1e8,"int Raig_ManSimulate(Aig_Man_t *, int, int, int, int, int)");
            }
            pAVar6 = Raig_ManGenerateCounter
                               (pAig,iVar9,uVar4,(int)local_48,local_4c,pRVar1->vCis2Ids);
            pAig->pSeqModel = pAVar6;
            if (fVerbose != 0) {
              printf("Miter is satisfiable after simulation (output %d).\n",(ulong)uVar4);
            }
            break;
          }
          iVar3 = clock_gettime(3,(timespec *)&local_78);
          if (iVar3 < 0) {
            lVar5 = -1;
          }
          else {
            lVar5 = (long)local_78._8_8_ / 1000 + local_78._0_8_ * 1000000;
          }
          if (local_38 <= (lVar5 + lVar7) / 1000000) {
            printf("No bug detected after %d frames with time limit %d seconds.\n",
                   (ulong)(iVar9 + 1),(ulong)(uint)TimeLimit);
            break;
          }
          iVar9 = iVar9 + 1;
        } while (nIters != iVar9);
      }
      pRVar1 = local_58;
      if (fVerbose != 0) {
        iVar9 = 0x91ab9e;
        printf("Maxcut = %8d.  AigMem = %7.2f MB.  SimMem = %7.2f MB.  ",
               (double)(local_58->nObjs << 4) * 9.5367431640625e-07,
               (double)(((int)local_48 * 4 + 4) * local_58->nMemsMax) * 9.5367431640625e-07);
        Abc_Print(iVar9,"%s =","Total time");
        iVar3 = 3;
        iVar9 = clock_gettime(3,(timespec *)&local_78);
        if (iVar9 < 0) {
          lVar7 = -1;
        }
        else {
          lVar7 = (long)local_78._8_8_ / 1000 + local_78._0_8_ * 1000000;
        }
        Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar7 - lVar8) / 1000000.0);
      }
      Raig_ManDelete(pRVar1);
      uVar4 = (uint)(0 < iVar2);
    }
  }
  else {
    printf("Miter is trivially satisfiable (output %d).\n",(ulong)(uint)local_78.iOut);
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

int Raig_ManSimulate( Aig_Man_t * pAig, int nWords, int nIters, int TimeLimit, int fMiter, int fVerbose )
{
    Raig_Man_t * p;
    Sec_MtrStatus_t Status;
    int i, iPat, RetValue = 0;
    abctime clk, clkTotal = Abc_Clock();
    assert( Aig_ManRegNum(pAig) > 0 );
    Status = Sec_MiterStatus( pAig );
    if ( Status.nSat > 0 )
    {
        printf( "Miter is trivially satisfiable (output %d).\n", Status.iOut );
        return 1;
    }
    if ( Status.nUndec == 0 )
    {
        printf( "Miter is trivially unsatisfiable.\n" );
        return 0;
    }
    Aig_ManRandom( 1 );
    p = Raig_ManCreate( pAig );
    p->nWords = nWords;
    // iterate through objects
    for ( i = 0; i < nIters; i++ )
    {
        clk = Abc_Clock();
        RetValue = Raig_ManSimulateRound( p, fMiter, i==0, &iPat );
        if ( fVerbose )
        {
            printf( "Frame %4d out of %4d and timeout %3d sec. ", i+1, nIters, TimeLimit );
            printf("Time = %7.2f sec\r", (1.0*Abc_Clock()-clkTotal)/CLOCKS_PER_SEC);
        }
        if ( RetValue > 0 )
        {
            int iOut = Raig_ManFindPo(p->pAig, RetValue);
            assert( pAig->pSeqModel == NULL );
            pAig->pSeqModel = Raig_ManGenerateCounter( pAig, i, iOut, nWords, iPat, p->vCis2Ids );
            if ( fVerbose )
            printf( "Miter is satisfiable after simulation (output %d).\n", iOut );
            break;
        }
        if ( (Abc_Clock() - clk)/CLOCKS_PER_SEC >= TimeLimit )
        {
            printf( "No bug detected after %d frames with time limit %d seconds.\n", i+1, TimeLimit );
            break;
        }
    }
    if ( fVerbose )
    {
        printf( "Maxcut = %8d.  AigMem = %7.2f MB.  SimMem = %7.2f MB.  ", 
            p->nMemsMax, 
            1.0*(p->nObjs * 16)/(1<<20), 
            1.0*(p->nMemsMax * 4 * (nWords+1))/(1<<20) );
        ABC_PRT( "Total time", Abc_Clock() - clkTotal );
    }
    Raig_ManDelete( p );
    return RetValue > 0;
}